

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O3

void read_engr_at(int x,int y)

{
  boolean bVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  engr *peVar5;
  char buf [256];
  char local_128 [231];
  undefined1 local_41;
  
  peVar5 = level->lev_engr;
  if (peVar5 == (engr *)0x0) {
    return;
  }
  while ((peVar5->engr_x != (char)x || (peVar5->engr_y != (char)y))) {
    peVar5 = peVar5->nxt_engr;
    if (peVar5 == (engr *)0x0) {
      return;
    }
  }
  if (*peVar5->engr_txt == '\0') {
    return;
  }
  if ((flags.run == 8) && ((level->locations[x][y].field_0x6 & 4) != 0)) {
    return;
  }
  switch(peVar5->engr_type) {
  case '\x01':
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0019824f;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00198246;
    }
    else {
LAB_00198246:
      if (ublindf == (obj *)0x0) {
        return;
      }
LAB_0019824f:
      if (ublindf->oartifact != '\x1d') {
        return;
      }
    }
    is_ice(level,x,y);
    pcVar4 = "Something is written here in the %s.";
    goto LAB_00198438;
  case '\x02':
  case '\x06':
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001981ca;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001981c5;
    }
    else {
LAB_001981c5:
      if (ublindf != (obj *)0x0) {
LAB_001981ca:
        if (ublindf->oartifact == '\x1d') goto LAB_00198303;
      }
      bVar1 = can_reach_floor();
      if (bVar1 == '\0') {
        return;
      }
    }
LAB_00198303:
    surface(x,y);
    pcVar4 = "Something is engraved here on the %s.";
    goto LAB_00198438;
  case '\x03':
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00198209;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00198204;
    }
    else {
LAB_00198204:
      if (ublindf != (obj *)0x0) {
LAB_00198209:
        if (ublindf->oartifact == '\x1d') goto LAB_0019833e;
      }
      bVar1 = can_reach_floor();
      if (bVar1 == '\0') {
        return;
      }
    }
LAB_0019833e:
    bVar1 = is_ice(level,x,y);
    pcVar4 = "melted";
    if (bVar1 == '\0') {
      pcVar4 = "burned";
    }
    pcVar3 = surface(x,y);
    pline("Some text has been %s into the %s here.",pcVar4,pcVar3);
    break;
  case '\x04':
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001982ce;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001982c5;
    }
    else {
LAB_001982c5:
      if (ublindf == (obj *)0x0) {
        return;
      }
LAB_001982ce:
      if (ublindf->oartifact != '\x1d') {
        return;
      }
    }
    surface(x,y);
    pcVar4 = "There\'s some graffiti on the %s here.";
LAB_00198438:
    pline(pcVar4);
    break;
  case '\x05':
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00198285;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0019827c;
    }
    else {
LAB_0019827c:
      if (ublindf == (obj *)0x0) {
        return;
      }
LAB_00198285:
      if (ublindf->oartifact != '\x1d') {
        return;
      }
    }
    pline("You see a message scrawled in blood here.");
    break;
  default:
    warning("Something is written in a very strange way.");
  }
  pcVar4 = peVar5->engr_txt;
  sVar2 = strlen(pcVar4);
  if (0xe7 < sVar2) {
    strncpy(local_128,pcVar4,0xe7);
    local_41 = 0;
    pcVar4 = local_128;
  }
  if ((u.roleplay.illiterate != '\0') && ((*pcVar4 != 'X' || (pcVar4[1] != '\0')))) {
    pline("But you cannot read.");
    goto LAB_0019850c;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001984b5;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001984b0;
    pcVar3 = "read";
  }
  else {
LAB_001984b0:
    if (ublindf == (obj *)0x0) {
      pcVar3 = "feel the words";
    }
    else {
LAB_001984b5:
      pcVar3 = "feel the words";
      if (ublindf->oartifact == '\x1d') {
        pcVar3 = "read";
      }
    }
  }
  pline("You %s: \"%s\".",pcVar3,pcVar4);
LAB_0019850c:
  if (1 < flags.run) {
    nomul(0,(char *)0x0);
  }
  if (moves < 6) {
    return;
  }
  check_tutorial_message(0x14f);
  return;
}

Assistant:

void read_engr_at(int x, int y)
{
	struct engr *ep = engr_at(level, x,y);
	int	sensed = 0;
	char buf[BUFSZ];
	
	/* Sensing an engraving does not require sight,
	 * nor does it necessarily imply comprehension (literacy).
	 */
	if (ep && ep->engr_txt[0] &&
	    /* Don't stop if travelling or autoexploring. */
	    !(flags.run == 8 && level->locations[x][y].mem_stepped)) {
	    switch(ep->engr_type) {
	    case DUST:
		if (!Blind) {
			sensed = 1;
			pline("Something is written here in the %s.",
				is_ice(level, x, y) ? "frost" : "dust");
		}
		break;
	    case ENGRAVE:
	    case HEADSTONE:
		if (!Blind || can_reach_floor()) {
			sensed = 1;
			pline("Something is engraved here on the %s.",
				surface(x,y));
		}
		break;
	    case BURN:
		if (!Blind || can_reach_floor()) {
			sensed = 1;
			pline("Some text has been %s into the %s here.",
				is_ice(level, x, y) ? "melted" : "burned",
				surface(x, y));
		}
		break;
	    case MARK:
		if (!Blind) {
			sensed = 1;
			pline("There's some graffiti on the %s here.",
				surface(x,y));
		}
		break;
	    case ENGR_BLOOD:
		/* "It's a message!  Scrawled in blood!"
		 * "What's it say?"
		 * "It says... `See you next Wednesday.'" -- Thriller
		 */
		if (!Blind) {
			sensed = 1;
			pline("You see a message scrawled in blood here.");
		}
		break;
	    default:
		warning("Something is written in a very strange way.");
		sensed = 1;
	    }
	    if (sensed) {
		char *et;
		unsigned maxelen = BUFSZ - sizeof("You feel the words: \"\". ");
		if (strlen(ep->engr_txt) > maxelen) {
			strncpy(buf,  ep->engr_txt, (int)maxelen);
			buf[maxelen] = '\0';
			et = buf;
		} else
			et = ep->engr_txt;
		if (u.roleplay.illiterate && strcmp(et, "X")) {
		    pline("But you cannot read.");
		} else {
		    pline("You %s: \"%s\".",
			  (Blind) ? "feel the words" : "read",  et);
		}
		if (flags.run > 1) nomul(0, NULL);
		if (moves > 5) check_tutorial_message(QT_T_ENGRAVING);
	    }
	}
}